

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-form.c
# Opt level: O1

size_t vstrnfmt(char *buf,size_t max,char *fmt,__va_list_tag *vp)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  uint uVar5;
  undefined8 *puVar6;
  ushort **ppuVar7;
  uint *puVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  long *plVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  int *s;
  byte bVar16;
  size_t sVar17;
  bool bVar18;
  char aux [128];
  char arg2 [1024];
  char tmp [1024];
  undefined8 local_8c0;
  byte local_8b8 [128];
  char local_838 [1024];
  char local_438;
  char local_437 [1031];
  
  if (max == 0) {
    __assert_fail("max",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-form.c"
                  ,0xcd,"size_t vstrnfmt(char *, size_t, const char *, struct __va_list_tag *)");
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-form.c"
                  ,0xce,"size_t vstrnfmt(char *, size_t, const char *, struct __va_list_tag *)");
  }
  local_8c0 = max - 1;
  sVar17 = 0;
LAB_002134fd:
  do {
    for (fmt = (char *)((byte *)fmt + 1); bVar16 = ((byte *)fmt)[-1], sVar9 = sVar17, bVar16 == 0x25
        ; fmt = (char *)((byte *)fmt + 2)) {
      if (*fmt != 0x6e) {
        if (*fmt == 0x25) {
          if (sVar17 == local_8c0) goto switchD_00213696_caseD_68;
          buf[sVar17] = '%';
          sVar17 = sVar17 + 1;
          fmt = (char *)((byte *)fmt + 1);
          goto LAB_002134fd;
        }
        local_8b8[0] = 0x25;
        bVar16 = *fmt;
        if (bVar16 == 0) goto LAB_00213966;
        uVar15 = 1;
        bVar18 = false;
        ppuVar7 = __ctype_b_loc();
        goto LAB_002135b1;
      }
      uVar11 = vp->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        puVar6 = (undefined8 *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        puVar6 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar6 + 1;
      }
      *(size_t *)*puVar6 = sVar17;
    }
    if ((bVar16 == 0) || (sVar17 == local_8c0)) goto switchD_00213696_caseD_68;
    buf[sVar17] = bVar16;
    sVar17 = sVar17 + 1;
  } while( true );
LAB_002135b1:
  if (100 < uVar15) goto LAB_00213966;
  if ((*(byte *)((long)*ppuVar7 + (ulong)bVar16 * 2 + 1) & 4) == 0) {
    bVar2 = bVar18;
    if (bVar16 != 0x2a) goto LAB_002135f8;
    uVar11 = vp->gp_offset;
    if ((ulong)uVar11 < 0x29) {
      puVar8 = (uint *)((ulong)uVar11 + (long)vp->reg_save_area);
      vp->gp_offset = uVar11 + 8;
    }
    else {
      puVar8 = (uint *)vp->overflow_arg_area;
      vp->overflow_arg_area = puVar8 + 2;
    }
    snprintf((char *)(local_8b8 + uVar15),0x80 - uVar15,"%d",(ulong)*puVar8);
    uVar15 = uVar15 - 1;
    do {
      lVar3 = uVar15 + 1;
      uVar15 = uVar15 + 1;
    } while (local_8b8[lVar3] != 0);
  }
  else {
    bVar2 = true;
    if (bVar16 != 0x6c) goto LAB_00213658;
LAB_002135f8:
    local_8b8[uVar15] = bVar16;
    uVar15 = uVar15 + 1;
    bVar18 = bVar2;
  }
  bVar16 = ((byte *)fmt)[1];
  fmt = (char *)((byte *)fmt + 1);
  if (bVar16 == 0) goto LAB_00213966;
  goto LAB_002135b1;
LAB_00213658:
  local_8b8[uVar15] = bVar16;
  local_8b8[uVar15 + 1] = 0;
  local_438 = '\0';
  sVar9 = 0;
  if (bVar16 < 99) {
    if ((bVar16 == 0x45) || (bVar16 == 0x47)) goto switchD_00213696_caseD_65;
    if (bVar16 != 0x58) goto switchD_00213696_caseD_68;
switchD_00213696_caseD_64:
    uVar11 = vp->gp_offset;
    if (bVar18) {
      if (uVar11 < 0x29) {
        plVar12 = (long *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        plVar12 = (long *)vp->overflow_arg_area;
        vp->overflow_arg_area = plVar12 + 1;
      }
      pcVar13 = (char *)*plVar12;
      goto LAB_00213800;
    }
    if (uVar11 < 0x29) {
      puVar8 = (uint *)((ulong)uVar11 + (long)vp->reg_save_area);
      vp->gp_offset = uVar11 + 8;
    }
    else {
      puVar8 = (uint *)vp->overflow_arg_area;
      vp->overflow_arg_area = puVar8 + 2;
    }
    uVar11 = *puVar8;
LAB_0021381b:
    snprintf(&local_438,0x400,(char *)local_8b8,(ulong)uVar11);
  }
  else {
    switch(bVar16) {
    case 99:
      uVar11 = vp->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        puVar8 = (uint *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        puVar8 = (uint *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar8 + 2;
      }
      uVar11 = *puVar8;
      goto LAB_0021381b;
    case 100:
    case 0x69:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_00213696_caseD_64;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_00213696_caseD_65:
      uVar11 = vp->fp_offset;
      if ((ulong)uVar11 < 0xa1) {
        puVar6 = (undefined8 *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->fp_offset = uVar11 + 0x10;
      }
      else {
        puVar6 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar6 + 1;
      }
      snprintf(&local_438,0x400,(char *)local_8b8,*puVar6);
      goto LAB_0021382f;
    default:
      goto switchD_00213696_caseD_68;
    case 0x70:
      uVar11 = vp->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        plVar12 = (long *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        plVar12 = (long *)vp->overflow_arg_area;
        vp->overflow_arg_area = plVar12 + 1;
      }
      pcVar13 = (char *)*plVar12;
      break;
    case 0x73:
      if (bVar18) {
        uVar11 = vp->gp_offset;
        if ((ulong)uVar11 < 0x29) {
          plVar12 = (long *)((ulong)uVar11 + (long)vp->reg_save_area);
          vp->gp_offset = uVar11 + 8;
        }
        else {
          plVar12 = (long *)vp->overflow_arg_area;
          vp->overflow_arg_area = plVar12 + 1;
        }
        s = (int *)*plVar12;
        if (s == (wchar_t *)0x0) {
          s = anon_var_dwarf_1f2034;
        }
        sVar9 = text_wcslen(s);
        uVar5 = (uint)sVar9;
        uVar11 = 0x2ff;
        if ((int)uVar5 < 0x2ff) {
          uVar11 = uVar5;
        }
        if (0 < (int)uVar5) {
          uVar10 = 1;
          if (1 < (int)uVar11) {
            uVar10 = (ulong)uVar11;
          }
          uVar14 = 0;
          do {
            local_838[uVar14] = (char)s[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
        }
        local_838[(int)uVar11] = '\0';
        pbVar1 = local_8b8 + (uVar15 - 1);
        pbVar1[0] = 0x73;
        pbVar1[1] = 0;
        snprintf(&local_438,0x400,(char *)local_8b8,local_838);
        goto LAB_0021382f;
      }
      uVar11 = vp->gp_offset;
      if ((ulong)uVar11 < 0x29) {
        plVar12 = (long *)((ulong)uVar11 + (long)vp->reg_save_area);
        vp->gp_offset = uVar11 + 8;
      }
      else {
        plVar12 = (long *)vp->overflow_arg_area;
        vp->overflow_arg_area = plVar12 + 1;
      }
      pcVar13 = (char *)*plVar12;
      if (pcVar13 == (char *)0x0) {
        pcVar13 = "";
      }
      my_strcpy(local_838,pcVar13,0x400);
      pcVar13 = local_838;
    }
LAB_00213800:
    snprintf(&local_438,0x400,(char *)local_8b8,pcVar13);
  }
LAB_0021382f:
  fmt = (char *)((byte *)fmt + 1);
  pcVar13 = local_437;
  sVar9 = sVar17;
  cVar4 = local_438;
  if (sVar17 != local_8c0 && local_438 != '\0') {
    do {
      sVar17 = sVar9 + 1;
      buf[sVar9] = cVar4;
      cVar4 = *pcVar13;
      if (cVar4 == '\0') break;
      pcVar13 = pcVar13 + 1;
      bVar18 = max - 2 != sVar9;
      sVar9 = sVar17;
    } while (bVar18);
  }
  goto LAB_002134fd;
LAB_00213966:
  sVar9 = 0;
switchD_00213696_caseD_68:
  buf[sVar9] = '\0';
  return sVar9;
}

Assistant:

size_t vstrnfmt(char *buf, size_t max, const char *fmt, va_list vp)
{
	const char *s;
	int i = 0, len = 0;

	/* The argument is "long" */
	bool do_long;

	/* Bytes used in buffer */
	size_t n;

	/* Bytes used in format sequence */
	size_t q;

	/* Format sequence */
	char aux[128];

	/* Resulting string */
	char tmp[1024];

	assert(max);
	assert(fmt);

	/* Begin the buffer */
	n = 0;

	/* Begin the format string */
	s = fmt;

	/* Scan the format string */
	while (true) {
		/* All done */
		if (!*s) break;

		/* Normal character */
		if (*s != '%') {
			/* Check total length */
			if (n == max-1) break;

			/* Save the character */
			buf[n++] = *s++;

			/* Continue */
			continue;
		}

		/* Skip the "percent" */
		s++;

		/* Pre-process "%%" */
		if (*s == '%') {
			/* Check total length */
			if (n == max-1) break;

			/* Save the percent */
			buf[n++] = '%';

			/* Skip the "%" */
			s++;

			/* Continue */
			continue;
		}

		/* Pre-process "%n" */
		if (*s == 'n') {
			size_t *arg;

			/* Get the next argument */
			arg = va_arg(vp, size_t *);

			/* Save the current length */
			(*arg) = n;

			/* Skip the "n" */
			s++;

			/* Continue */
			continue;
		}


		/* Begin the "aux" string */
		q = 0;

		/* Save the "percent" */
		aux[q++] = '%';

		do_long = false;

		/* Build the "aux" string */
		while (true) {
			/* Error -- format sequence is not terminated */
			if (!*s) {
				/* Terminate the buffer */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}

			/* Error -- format sequence may be too long */
			if (q > 100) {
				/* Terminate the buffer */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}

			/* Handle "alphabetic" or "non-alphabetic"chars */
			if (isalpha((unsigned char)*s)) {
				/* Hack -- handle "long" request */
				if (*s == 'l') {
					/* Save the character */
					aux[q++] = *s++;

					/* Note the "long" flag */
					do_long = true;
				} else {
					/* Save the character */
					aux[q++] = *s++;

					/* Stop processing the format sequence */
					break;
				}
			} else {
				/* Hack -- Handle 'star' (for "variable length" argument) */
				if (*s == '*') {
					int arg;

					/* Get the next argument */
					arg = va_arg(vp, int);

					/* Hack -- append the "length" */
					snprintf(aux + q, sizeof(aux) - q, "%d", arg);

					/* Hack -- accept the "length" */
					while (aux[q]) q++;

					/* Skip the "*" */
					s++;
				} else {
					/* Save the normal character (digits, "-", "+", ".", etc) */
					aux[q++] = *s++;
				}
			}
		}

		/* Terminate "aux" */
		aux[q] = '\0';

		/* Clear "tmp" */
		tmp[0] = '\0';

		/* Process the "format" symbol */
		switch (aux[q - 1]) {
			/* Simple Character -- standard format */
			case 'c':
			{
				int arg;

				/* Get the next argument */
				arg = va_arg(vp, int);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* Signed Integers -- standard format */
			case 'd': case 'i':
			{
				if (do_long) {
					long arg;

					/* Get the next argument */
					arg = va_arg(vp, long);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				} else {
					int arg;

					/* Get the next argument */
					arg = va_arg(vp, int);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				}

				/* Done */
				break;
			}

			/* Unsigned Integers -- various formats */
			case 'u': case 'o': case 'x': case 'X':
			{
				if (do_long) {
					unsigned long arg;

					/* Get the next argument */
					arg = va_arg(vp, unsigned long);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				} else {
					unsigned int arg;

					/* Get the next argument */
					arg = va_arg(vp, unsigned int);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				}

				/* Done */
				break;
			}

			/* Floating Point -- various formats */
			case 'f':
			case 'e': case 'E':
			case 'g': case 'G':
			{
				double arg;

				/* Get the next argument */
				arg = va_arg(vp, double);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* Pointer -- implementation varies */
			case 'p':
			{
				void *arg;

				/* Get the next argument */
				arg = va_arg(vp, void*);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* String */
			case 's':
			{
				if (do_long) {
					const wchar_t *arg;
					char arg2[1024];

					/* XXX There is a big bug here: if one
					 * passes "%.0s" to strnfmt, then really we
					 * should not dereference the arg at all.
					 * But it does.  See bug #666.
					 */

					/* Get the next argument */
					arg = va_arg(vp, const wchar_t *);

					/* Hack -- convert NULL to EMPTY */
					if (!arg) arg = L"";

					/* Prevent buffer overflows and convert string to char */
					/* this really should use a wcstombs type function */
					len = text_wcslen(arg);
					if (len >= 768) {
						len = 767;
					}
					for (i = 0; i < len; ++i) {
						arg2[i] = (char)arg[i];
					}
					arg2[len] = '\0';

					/* Remove the l from aux, since we no longer have wchar_t
					 * as input */
					aux[q-2] = 's';
					aux[q-1] = '\0';

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg2);

					/* Done */
					break;
				} else {
					const char *arg;
					char arg2[1024];

					/* XXX There is a big bug here: if one
					 * passes "%.0s" to strnfmt, then really we
					 * should not dereference the arg at all.
					 * But it does.  See bug #666.
					 */

					/* Get the next argument */
					arg = va_arg(vp, const char *);

					/* Hack -- convert NULL to EMPTY */
					if (!arg) arg = "";

					/* Prevent buffer overflows */
					(void)my_strcpy(arg2, arg, sizeof(arg2));

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg2);

					/* Done */
					break;
				}
			}

			/* Oops */
			default:
			{
				/* Error -- illegal format char */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}
		}

		/* Now append "tmp" to "buf" */
		for (q = 0; tmp[q]; q++) {
			/* Check total length */
			if (n == max-1) break;

			/* Save the character */
			buf[n++] = tmp[q];
		}
	}


	/* Terminate buffer */
	buf[n] = '\0';

	/* Return length */
	return (n);
}